

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * __thiscall
pbrt::PointLight::Bounds(LightBounds *__return_storage_ptr__,PointLight *this)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  float *pfVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM17 [64];
  
  auVar14 = in_ZMM17._0_16_;
  fVar1 = this->scale;
  pfVar5 = (this->I).values.ptr;
  uVar6 = (this->I).values.nStored;
  if (1 < uVar6) {
    uVar6 = uVar6 * 4;
    uVar7 = uVar6 - 4;
    bVar11 = uVar7 == 0;
    pfVar10 = pfVar5;
    pfVar9 = pfVar5;
    do {
      uVar8 = uVar7;
      pfVar9 = pfVar9 + 1;
      auVar14 = vucomiss_avx512f(ZEXT416((uint)*pfVar10));
      pfVar5 = pfVar9;
      if (3 < uVar6 || bVar11) {
        pfVar5 = pfVar10;
      }
      uVar7 = uVar8 - 4;
      bVar11 = uVar7 == 0;
      pfVar10 = pfVar5;
      uVar6 = uVar8;
    } while (!bVar11);
  }
  auVar13 = vxorps_avx512vl(auVar14,auVar14);
  auVar14 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][1]),auVar13)
  ;
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]),
                                auVar13,auVar14);
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]),
                                auVar13,auVar14);
  fVar3 = (this->super_LightBase).renderFromLight.m.m[3][3] + auVar14._0_4_;
  bVar11 = fVar3 == 1.0;
  auVar14 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][1]),auVar13)
  ;
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]),
                                auVar13,auVar14);
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]),
                                auVar13,auVar14);
  fVar12 = (this->super_LightBase).renderFromLight.m.m[0][3] + auVar14._0_4_;
  auVar14 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),auVar13)
  ;
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),
                                auVar13,auVar14);
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),
                                auVar13,auVar14);
  fVar4 = (this->super_LightBase).renderFromLight.m.m[1][3] + auVar14._0_4_;
  auVar14 = vinsertps_avx(ZEXT416((uint)bVar11 * (int)fVar12 + (uint)!bVar11 * (int)(fVar12 / fVar3)
                                 ),ZEXT416((uint)bVar11 * (int)fVar4 +
                                           (uint)!bVar11 * (int)(fVar4 / fVar3)),0x10);
  auVar15 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][1]),auVar13)
  ;
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]),
                                auVar13,auVar15);
  auVar13 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]),
                                auVar13,auVar15);
  fVar12 = (this->super_LightBase).renderFromLight.m.m[2][3] + auVar13._0_4_;
  fVar12 = (float)((uint)bVar11 * (int)fVar12 + (uint)!bVar11 * (int)(fVar12 / fVar3));
  fVar3 = *pfVar5;
  uVar2 = vmovlps_avx(auVar14);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar12;
  uVar2 = vmovlps_avx(auVar14);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar12;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  __return_storage_ptr__->phi = fVar1 * 12.566371 * fVar3;
  __return_storage_ptr__->theta_o = 3.1415927;
  __return_storage_ptr__->theta_e = 1.5707964;
  __return_storage_ptr__->cosTheta_o = -1.0;
  __return_storage_ptr__->cosTheta_e = -4.371139e-08;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds PointLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    return LightBounds(p, Vector3f(0, 0, 1), 4 * Pi * scale * I.MaxValue(), Pi, Pi / 2,
                       false);
}